

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

ImfLut * ImfNewRound12logLut(int channels)

{
  float fVar1;
  half hVar2;
  ImfLut *pIVar3;
  void *pvVar4;
  int i;
  ulong uVar5;
  
  pIVar3 = (ImfLut *)operator_new(0x10);
  pvVar4 = operator_new__(0x20000);
  *(void **)pIVar3 = pvVar4;
  uVar5 = 0;
  do {
    if ((uVar5 & 0x3ff) == 0 || (~(uint)uVar5 & 0x7c00) != 0) {
      if (((uint)uVar5 & 0x7fff) == 0x7c00) {
        *(ushort *)((long)pvVar4 + uVar5 * 2) =
             (ushort)(-1 < (short)(uint16_t)uVar5) * -0x8000 + -0x400;
      }
      else {
        fVar1 = *(float *)(_imath_half_to_float_table + uVar5 * 4);
        if ((fVar1 < *(float *)(_imath_half_to_float_table + 0x3effc)) ||
           (*(float *)(_imath_half_to_float_table + 0x1effc) <= fVar1 &&
            fVar1 != *(float *)(_imath_half_to_float_table + 0x1effc))) {
          *(undefined2 *)((long)pvVar4 + uVar5 * 2) = 0;
        }
        else {
          hVar2 = Imf_3_4::round12log((uint16_t)uVar5);
          *(uint16_t *)((long)pvVar4 + uVar5 * 2) = hVar2._h;
        }
      }
    }
    else {
      *(undefined2 *)((long)pvVar4 + uVar5 * 2) = 0x7fff;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x10000);
  *(int *)(pIVar3 + 8) = channels;
  return pIVar3;
}

Assistant:

ImfLut*
ImfNewRound12logLut (int channels)
{
    try
    {
        return (ImfLut*) new OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaLut (
            OPENEXR_IMF_INTERNAL_NAMESPACE::round12log,
            OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}